

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown-tokens.cpp
# Opt level: O3

string * markdown::token::RawText::_processLinksImagesAndTags
                   (string *__return_storage_ptr__,string *src,ReplacementTable *replacements,
                   LinkIds *idTable)

{
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  size_type sVar4;
  shared_count sVar5;
  vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
  *replacements_00;
  bool bVar6;
  string sVar7;
  int iVar8;
  const_reference pvVar9;
  long *plVar10;
  Image *this;
  RawText *pRVar11;
  HtmlAnchorTag *pHVar12;
  HtmlTag *pHVar13;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var14;
  size_t sVar15;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var16;
  _List_node_base *p_Var17;
  Container *pCVar18;
  long lVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  type tVar22;
  undefined8 uVar23;
  byte *pbVar24;
  _Alloc_hider _Var25;
  string *psVar26;
  byte bVar27;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  byte bVar29;
  string contentsOrAlttext;
  string linkId;
  string url;
  optional<markdown::LinkIds::Target> target;
  string title;
  smatch m;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [32];
  undefined1 local_188 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined1 auStack_15e [34];
  bool local_13c;
  string local_138;
  shared_ptr<markdown::Token> local_118;
  _List_node_base local_108;
  vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
  *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  string *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  undefined1 local_d0;
  undefined7 uStack_cf;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  LinkIds *local_a8;
  lcast_put_unsigned<std::char_traits<char>,_unsigned_long,_char> local_a0;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_88;
  
  local_f8 = (vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
              *)replacements;
  local_a8 = idTable;
  if ((_processLinksImagesAndTags(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&,markdown::LinkIds_const&)
       ::cExpression == '\0') &&
     (iVar8 = __cxa_guard_acquire(&_processLinksImagesAndTags(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&,markdown::LinkIds_const&)
                                   ::cExpression), iVar8 != 0)) {
    boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
    basic_regex(&_processLinksImagesAndTags::cExpression,
                "(?:(!?)\\[([^\\]]+?)\\] *\\(([^\\(]*(?:\\(.*?\\).*?)*?)\\))|(?:(!?)\\[((?:[^]]*?\\[.*?\\].*?)|(?:.+?))\\](?: *\\[(.*?)\\])?)|(?:<(/?([a-zA-Z0-9]+).*?)>)"
                ,0);
    __cxa_atexit(boost::
                 basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
                 ~basic_regex,&_processLinksImagesAndTags::cExpression,&__dso_handle);
    __cxa_guard_release(&_processLinksImagesAndTags(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&,markdown::LinkIds_const&)
                         ::cExpression);
    replacements = (ReplacementTable *)local_f8;
  }
  local_b8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_b8;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  first._M_current = (src->_M_dataplus)._M_p;
  local_c0._M_current = first._M_current + src->_M_string_length;
  local_e8 = __return_storage_ptr__;
  do {
    local_88.m_null.
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .first._M_current = (char *)0x0;
    local_88.m_null.
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .second._M_current = (char *)0x0;
    local_88.m_subs.
    super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.m_base._M_current = (char *)0x0;
    local_88.m_subs.
    super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.m_subs.
    super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.m_null.matched = false;
    local_88.m_named_subs.px = (element_type *)0x0;
    local_88.m_named_subs.pn.pi_ = (sp_counted_base *)0x0;
    local_88.m_last_closed_paren = 0;
    local_88.m_is_singular = true;
    bVar6 = boost::
            regex_search<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                      (first,local_c0,&local_88,&_processLinksImagesAndTags::cExpression,
                       format_default,first);
    if (!bVar6) {
      local_188._0_8_ = &local_178;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)local_188,first._M_current,local_c0._M_current);
      std::__cxx11::string::_M_append((char *)local_e8,local_188._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._0_8_ != &local_178) {
        operator_delete((void *)local_188._0_8_,local_178._M_allocated_capacity + 1);
      }
      boost::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~match_results(&local_88);
      return local_e8;
    }
    pvVar9 = boost::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[](&local_88,0);
    if (pvVar9->matched == false) {
      __assert_fail("m[0].matched",
                    "/workspace/llm4binary/github/license_c_cmakelists/sevenjay[P]cpp-markdown/src/markdown-tokens.cpp"
                    ,0x17d,
                    "static std::string markdown::token::RawText::_processLinksImagesAndTags(const std::string &, ReplacementTable &, const LinkIds &)"
                   );
    }
    pvVar9 = boost::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[](&local_88,0);
    if ((pvVar9->matched != true) ||
       ((pvVar9->
        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).second._M_current ==
        (pvVar9->
        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).first._M_current)) {
      __assert_fail("m[0].length()!=0",
                    "/workspace/llm4binary/github/license_c_cmakelists/sevenjay[P]cpp-markdown/src/markdown-tokens.cpp"
                    ,0x17e,
                    "static std::string markdown::token::RawText::_processLinksImagesAndTags(const std::string &, ReplacementTable &, const LinkIds &)"
                   );
    }
    pvVar9 = boost::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[](&local_88,0);
    local_188._0_8_ = &local_178;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)local_188,first._M_current,
               (pvVar9->
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).first._M_current);
    std::__cxx11::string::_M_append((char *)local_e8,local_188._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._0_8_ != &local_178) {
      operator_delete((void *)local_188._0_8_,local_178._M_allocated_capacity + 1);
    }
    local_1c8._M_dataplus._M_p =
         (pointer)((long)*(pointer *)((long)replacements + 8) - *(long *)replacements >> 4);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    local_138._M_string_length = 0;
    local_138.field_2._M_local_buf[0] = '\0';
    auStack_15e._6_8_ = local_188 + 2;
    local_1c8.field_2._M_local_buf[0] = 0x30;
    local_1c8.field_2._M_allocated_capacity._4_4_ = 0x30;
    local_1c8._M_string_length = (size_type)((long)register0x00000020 + -0x15e);
    auStack_15e._14_8_ = (string *)((long)register0x00000020 + -0x15e);
    auStack_15e._6_8_ =
         boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_long,_char>::convert
                   ((lcast_put_unsigned<std::char_traits<char>,_unsigned_long,_char> *)&local_1c8);
    auStack_15e._14_8_ = (string *)((long)register0x00000020 + -0x15e);
    std::__cxx11::string::replace
              ((ulong)&local_138,0,(char *)local_138._M_string_length,auStack_15e._6_8_);
    plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x1571d5);
    local_1a8._0_8_ = &((string *)local_1a8)->field_2;
    psVar26 = (string *)(plVar10 + 2);
    if ((string *)*plVar10 == psVar26) {
      local_1a8._16_8_ = (psVar26->_M_dataplus)._M_p;
      local_1a8._24_8_ = plVar10[3];
    }
    else {
      local_1a8._16_8_ = (psVar26->_M_dataplus)._M_p;
      local_1a8._0_8_ = (string *)*plVar10;
    }
    local_1a8._8_8_ = plVar10[1];
    *plVar10 = (long)psVar26;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)local_1a8);
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 == paVar20) {
      local_1e8.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_1e8.field_2._8_8_ = plVar10[3];
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_1e8._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_1e8._M_string_length = plVar10[1];
    *plVar10 = (long)paVar20;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_e8,(ulong)local_1e8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((string *)local_1a8._0_8_ != (string *)&((string *)local_1a8)->field_2) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,
                      CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                               local_138.field_2._M_local_buf[0]) + 1);
    }
    pvVar9 = boost::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[](&local_88,0);
    first._M_current =
         (pvVar9->
         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ).second._M_current;
    pvVar9 = boost::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[](&local_88,4);
    if ((pvVar9->matched == true) &&
       (pvVar9 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&local_88,4), pvVar9->matched == true)) {
      bVar3 = true;
      bVar6 = true;
      if ((pvVar9->
          super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).second._M_current ==
          (pvVar9->
          super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).first._M_current) goto LAB_001491c1;
LAB_00149230:
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      local_1e8._M_string_length = 0;
      local_1e8.field_2._M_allocated_capacity =
           local_1e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_1a8._0_8_ = &((string *)local_1a8)->field_2;
      local_1a8._8_8_ = (string *)0x0;
      local_1a8._16_8_ = local_1a8._16_8_ & 0xffffffffffffff00;
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      local_138._M_string_length = 0;
      local_138.field_2._M_local_buf[0] = '\0';
      if (bVar6) {
        pvVar9 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&local_88,5);
        if (pvVar9->matched == true) {
          local_188._0_8_ = &local_178;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)local_188,
                     (pvVar9->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (pvVar9->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          local_188._0_8_ = &local_178;
          local_188._8_8_ = (type)0x0;
          local_178._M_allocated_capacity = local_178._M_allocated_capacity & 0xffffffffffffff00;
        }
        std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_188);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._0_8_ != &local_178) {
          operator_delete((void *)local_188._0_8_,local_178._M_allocated_capacity + 1);
        }
        pvVar9 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&local_88,6);
        if ((pvVar9->matched == true) &&
           (pvVar9 = boost::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[](&local_88,6), pvVar9->matched == true)) {
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_1c8,
                     (pvVar9->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (pvVar9->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
          if ((string *)local_1c8._M_string_length == (string *)0x0) goto LAB_00149397;
        }
        else {
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          local_1c8._M_string_length = 0;
          local_1c8.field_2._M_allocated_capacity =
               local_1c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
LAB_00149397:
          sVar4 = local_1e8._M_string_length;
          _Var25._M_p = local_1e8._M_dataplus._M_p;
          local_188._0_8_ = &local_178;
          local_188._8_8_ = (type)0x0;
          local_178._M_allocated_capacity = local_178._M_allocated_capacity & 0xffffffffffffff00;
          if (local_1e8._M_string_length != 0) {
            lVar19 = 0;
            do {
              if (((_Var25._M_p[lVar19] != 0x20) || ((type)local_188._8_8_ == (type)0x0)) ||
                 (*(byte *)(local_188._0_8_ + (local_188._8_8_ - 1)) != 0x20)) {
                std::__cxx11::string::push_back((char)local_188);
              }
              lVar19 = lVar19 + 1;
            } while (sVar4 != lVar19);
          }
          std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_188);
          replacements = (ReplacementTable *)local_f8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._0_8_ != &local_178) {
            operator_delete((void *)local_188._0_8_,local_178._M_allocated_capacity + 1);
            replacements = (ReplacementTable *)local_f8;
          }
        }
        LinkIds::find((optional<markdown::LinkIds::Target> *)local_188,local_a8,&local_1c8);
        sVar7 = local_188[0];
        if (local_188[0] == (string)0x1) {
          std::__cxx11::string::_M_assign((string *)local_1a8);
          if (local_188[0] == (string)0x0) {
            __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c6,
                          "pointer_type boost::optional<markdown::LinkIds::Target>::operator->() [T = markdown::LinkIds::Target]"
                         );
          }
          std::__cxx11::string::_M_assign((string *)&local_138);
        }
        boost::optional_detail::optional_base<markdown::LinkIds::Target>::~optional_base
                  ((optional_base<markdown::LinkIds::Target> *)local_188);
      }
      else {
        if ((_processLinksImagesAndTags(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&,markdown::LinkIds_const&)
             ::cReference == '\0') &&
           (iVar8 = __cxa_guard_acquire(&_processLinksImagesAndTags(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&,markdown::LinkIds_const&)
                                         ::cReference), iVar8 != 0)) {
          boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
          basic_regex(&_processLinksImagesAndTags::cReference,
                      "^<?([^ >]*)>?(?: *(?:(\'|\")(.*)\\2)|(?:\\((.*)\\)))? *$",0);
          __cxa_atexit(boost::
                       basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                       ::~basic_regex,&_processLinksImagesAndTags::cReference,&__dso_handle);
          __cxa_guard_release(&_processLinksImagesAndTags(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&,markdown::LinkIds_const&)
                               ::cReference);
          replacements = (ReplacementTable *)local_f8;
        }
        pvVar9 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&local_88,2);
        if (pvVar9->matched == true) {
          local_188._0_8_ = &local_178;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)local_188,
                     (pvVar9->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (pvVar9->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          local_188._0_8_ = &local_178;
          local_188._8_8_ = (type)0x0;
          local_178._M_allocated_capacity = local_178._M_allocated_capacity & 0xffffffffffffff00;
        }
        std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_188);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._0_8_ != &local_178) {
          operator_delete((void *)local_188._0_8_,local_178._M_allocated_capacity + 1);
        }
        pvVar9 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&local_88,3);
        if (pvVar9->matched == true) {
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_1c8,
                     (pvVar9->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (pvVar9->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          local_1c8._M_string_length = 0;
          local_1c8.field_2._M_allocated_capacity =
               local_1c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        }
        local_168 = 0;
        uStack_160 = 0;
        local_178._M_allocated_capacity = 0;
        local_178._8_8_ = 0;
        local_188._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_188._8_8_ = (type)0x0;
        auStack_15e._6_8_ = auStack_15e._6_8_ & 0xffffffffffffff00;
        auStack_15e._14_8_ = (string *)0x0;
        auStack_15e._22_8_ = 0;
        auStack_15e._30_4_ = 0;
        local_13c = true;
        sVar7 = (string)boost::
                        regex_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )local_1c8._M_dataplus._M_p,
                                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )(local_1c8._M_dataplus._M_p + local_1c8._M_string_length),
                                   (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    *)local_188,&_processLinksImagesAndTags::cReference,
                                   format_default);
        if ((bool)sVar7) {
          pvVar9 = boost::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)local_188,1);
          if (pvVar9->matched == true) {
            local_118.px = (element_type *)&local_108;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_118,
                       (pvVar9->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).first._M_current,
                       (pvVar9->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).second._M_current);
          }
          else {
            local_118.px = (element_type *)&local_108;
            local_118.pn.pi_ = (sp_counted_base *)0x0;
            local_108._M_next = (_List_node_base *)((ulong)local_108._M_next & 0xffffffffffffff00);
          }
          std::__cxx11::string::operator=((string *)local_1a8,(string *)&local_118);
          if ((_List_node_base *)local_118.px != &local_108) {
            operator_delete(local_118.px,(ulong)((long)&(local_108._M_next)->_M_next + 1));
          }
          pvVar9 = boost::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)local_188,3);
          if (pvVar9->matched == true) {
            pvVar9 = boost::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)local_188,3);
            if (pvVar9->matched == true) {
              local_118.px = (element_type *)&local_108;
              std::__cxx11::string::
              _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        ((string *)&local_118,
                         (pvVar9->
                         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ).first._M_current,
                         (pvVar9->
                         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ).second._M_current);
            }
            else {
LAB_001496ed:
              local_118.px = (element_type *)&local_108;
              local_118.pn.pi_ = (sp_counted_base *)0x0;
              local_108._M_next = (_List_node_base *)((ulong)local_108._M_next & 0xffffffffffffff00)
              ;
            }
          }
          else {
            pvVar9 = boost::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)local_188,4);
            if (pvVar9->matched != true) goto LAB_0014974b;
            pvVar9 = boost::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)local_188,4);
            if (pvVar9->matched != true) goto LAB_001496ed;
            local_118.px = (element_type *)&local_108;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_118,
                       (pvVar9->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).first._M_current,
                       (pvVar9->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).second._M_current);
          }
          std::__cxx11::string::operator=((string *)&local_138,(string *)&local_118);
          if ((_List_node_base *)local_118.px != &local_108) {
            operator_delete(local_118.px,(ulong)((long)&(local_108._M_next)->_M_next + 1));
          }
        }
LAB_0014974b:
        boost::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)local_188);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if (sVar7 == (string)0x0) {
        pvVar9 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&local_88,0);
        pcVar2 = (pvVar9->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current;
        pRVar11 = (RawText *)operator_new(0x30);
        pvVar9 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&local_88,0);
        first._M_current = pcVar2 + 1;
        local_188._0_8_ = &local_178;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)local_188,
                   (pvVar9->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,first._M_current);
        (pRVar11->super_TextHolder).super_Token._vptr_Token =
             (_func_int **)&PTR__TextHolder_001662d0;
        (pRVar11->super_TextHolder).mText._M_dataplus._M_p =
             (pointer)&(pRVar11->super_TextHolder).mText.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&(pRVar11->super_TextHolder).mText,local_188._0_8_,
                   (byte *)(local_188._0_8_ + local_188._8_8_));
        (pRVar11->super_TextHolder).mCanContainMarkup = true;
        (pRVar11->super_TextHolder).mEncodingFlags = 0xd;
        (pRVar11->super_TextHolder).super_Token._vptr_Token =
             (_func_int **)&PTR__TextHolder_00166388;
        boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::RawText>
                  ((shared_ptr<markdown::Token> *)&local_1c8,pRVar11);
        replacements = (ReplacementTable *)local_f8;
        std::
        vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
        ::emplace_back<boost::shared_ptr<markdown::Token>>
                  (local_f8,(shared_ptr<markdown::Token> *)&local_1c8);
LAB_00149b69:
        boost::detail::shared_count::~shared_count((shared_count *)&local_1c8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._0_8_ != &local_178) {
          operator_delete((void *)local_188._0_8_,local_178._M_allocated_capacity + 1);
        }
      }
      else {
        if (!bVar3) {
          pHVar12 = (HtmlAnchorTag *)operator_new(0x30);
          HtmlAnchorTag::HtmlAnchorTag(pHVar12,(string *)local_1a8,&local_138);
          boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlAnchorTag>
                    ((shared_ptr<markdown::Token> *)local_188,pHVar12);
          std::
          vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
          ::emplace_back<boost::shared_ptr<markdown::Token>>
                    ((vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
                      *)replacements,(shared_ptr<markdown::Token> *)local_188);
          boost::detail::shared_count::~shared_count((shared_count *)(local_188 + 8));
          std::__cxx11::string::_M_append((char *)local_e8,(ulong)local_1e8._M_dataplus._M_p);
          local_a0.m_value = *(long *)((long)replacements + 8) - *(long *)replacements >> 4;
          local_e0 = &local_d0;
          local_d8 = (char *)0x0;
          local_d0 = 0;
          auStack_15e._6_8_ = local_188 + 2;
          local_a0.m_czero = '0';
          local_a0.m_zero = 0x30;
          auStack_15e._14_8_ = (string *)((long)register0x00000020 + -0x15e);
          local_a0.m_finish = (char *)((long)register0x00000020 + -0x15e);
          auStack_15e._6_8_ =
               boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_long,_char>::
               convert(&local_a0);
          auStack_15e._14_8_ = (string *)((long)register0x00000020 + -0x15e);
          std::__cxx11::string::replace((ulong)&local_e0,0,local_d8,auStack_15e._6_8_);
          plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,0x1571d5);
          p_Var17 = (_List_node_base *)(plVar10 + 2);
          if ((_List_node_base *)*plVar10 == p_Var17) {
            local_108._M_next = p_Var17->_M_next;
            local_108._M_prev = (_List_node_base *)plVar10[3];
            local_118.px = (element_type *)&local_108;
          }
          else {
            local_108._M_next = p_Var17->_M_next;
            local_118.px = (element_type *)*plVar10;
          }
          local_118.pn.pi_ = (sp_counted_base *)plVar10[1];
          *plVar10 = (long)p_Var17;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_118);
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          psVar26 = (string *)(plVar10 + 2);
          if ((string *)*plVar10 == psVar26) {
            local_1c8.field_2._M_allocated_capacity = (size_type)psVar26->_M_dataplus;
            local_1c8.field_2._8_8_ = plVar10[3];
          }
          else {
            local_1c8.field_2._M_allocated_capacity = (size_type)psVar26->_M_dataplus;
            local_1c8._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_1c8._M_string_length = plVar10[1];
          *plVar10 = (long)psVar26;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_e8,(ulong)local_1c8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          if ((_List_node_base *)local_118.px != &local_108) {
            operator_delete(local_118.px,(ulong)((long)&(local_108._M_next)->_M_next + 1));
          }
          if (local_e0 != &local_d0) {
            operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
          }
          pHVar13 = (HtmlTag *)operator_new(0x30);
          local_188._0_8_ = &local_178;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"/a","");
          (pHVar13->super_TextHolder).super_Token._vptr_Token =
               (_func_int **)&PTR__TextHolder_001662d0;
          (pHVar13->super_TextHolder).mText._M_dataplus._M_p =
               (pointer)&(pHVar13->super_TextHolder).mText.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&(pHVar13->super_TextHolder).mText,local_188._0_8_,
                     (byte *)(local_188._0_8_ + local_188._8_8_));
          (pHVar13->super_TextHolder).mCanContainMarkup = false;
          (pHVar13->super_TextHolder).mEncodingFlags = 5;
          (pHVar13->super_TextHolder).super_Token._vptr_Token =
               (_func_int **)&PTR__TextHolder_00166060;
          boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlTag>
                    ((shared_ptr<markdown::Token> *)&local_1c8,pHVar13);
          replacements = (ReplacementTable *)local_f8;
          std::
          vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
          ::emplace_back<boost::shared_ptr<markdown::Token>>
                    (local_f8,(shared_ptr<markdown::Token> *)&local_1c8);
          goto LAB_00149b69;
        }
        this = (Image *)operator_new(0x68);
        Image::Image(this,&local_1e8,(string *)local_1a8,&local_138);
        boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::Image>
                  ((shared_ptr<markdown::Token> *)local_188,this);
        std::
        vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
        ::emplace_back<boost::shared_ptr<markdown::Token>>
                  ((vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
                    *)replacements,(shared_ptr<markdown::Token> *)local_188);
        boost::detail::shared_count::~shared_count((shared_count *)(local_188 + 8));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,
                        CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                 local_138.field_2._M_local_buf[0]) + 1);
      }
      if ((string *)local_1a8._0_8_ != (string *)&((string *)local_1a8)->field_2) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
      }
      uVar23 = local_1e8.field_2._M_allocated_capacity;
      _Var25._M_p = local_1e8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
LAB_00149be3:
        operator_delete(_Var25._M_p,uVar23 + 1);
      }
    }
    else {
LAB_001491c1:
      pvVar9 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&local_88,1);
      if (((pvVar9->matched == true) &&
          (pvVar9 = boost::
                    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::operator[](&local_88,1), pvVar9->matched == true)) &&
         ((pvVar9->
          super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).second._M_current !=
          (pvVar9->
          super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).first._M_current)) {
        bVar3 = true;
LAB_0014922e:
        bVar6 = false;
        goto LAB_00149230;
      }
      pvVar9 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&local_88,5);
      if (pvVar9->matched != false) {
        bVar6 = true;
        bVar3 = false;
        goto LAB_00149230;
      }
      pvVar9 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&local_88,2);
      if (pvVar9->matched == true) {
        bVar3 = false;
        goto LAB_0014922e;
      }
      pvVar9 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&local_88,7);
      if (pvVar9->matched == true) {
        local_188._0_8_ = &local_178;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)local_188,
                   (pvVar9->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   (pvVar9->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
        bVar29 = *(byte *)local_188._0_8_;
      }
      else {
        local_188._0_8_ = &local_178;
        local_188._8_8_ = (type)0x0;
        local_178._M_allocated_capacity = local_178._M_allocated_capacity & 0xffffffffffffff00;
        bVar29 = 0;
      }
      lVar19 = 0;
      do {
        pbVar24 = (&PTR_anon_var_dwarf_c8926_001667b0)[lVar19];
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._0_8_;
        bVar1 = bVar29;
        while (bVar1 != 0) {
          paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)paVar20 + 1);
          bVar27 = *pbVar24;
          if (bVar1 != bVar27) goto LAB_00149c45;
          pbVar24 = pbVar24 + 1;
          bVar1 = paVar20->_M_local_buf[0];
        }
        bVar27 = *pbVar24;
LAB_00149c45:
      } while ((bVar27 != 0) && (lVar19 = lVar19 + 1, lVar19 != 7));
      if (bVar27 == 0) {
        local_1a8._0_8_ = local_1a8;
        local_1a8._16_8_ = 0;
        local_1a8._8_8_ = local_1a8._0_8_;
        pHVar12 = (HtmlAnchorTag *)operator_new(0x30);
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        local_1e8._M_string_length = 0;
        local_1e8.field_2._M_allocated_capacity =
             local_1e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        HtmlAnchorTag::HtmlAnchorTag(pHVar12,(string *)local_188,&local_1e8);
        boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlAnchorTag>
                  ((shared_ptr<markdown::Token> *)&local_138,pHVar12);
        p_Var17 = (_List_node_base *)operator_new(0x20);
        sVar4 = local_138._M_string_length;
        local_138._M_string_length = 0;
        p_Var17[1]._M_next = (_List_node_base *)local_138._M_dataplus._M_p;
        p_Var17[1]._M_prev = (_List_node_base *)sVar4;
        local_138._M_dataplus._M_p = (pointer)0x0;
        std::__detail::_List_node_base::_M_hook(p_Var17);
        local_1a8._16_8_ = local_1a8._16_8_ + 1;
        boost::detail::shared_count::~shared_count((shared_count *)&local_138._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        pRVar11 = (RawText *)operator_new(0x30);
        (pRVar11->super_TextHolder).super_Token._vptr_Token =
             (_func_int **)&PTR__TextHolder_001662d0;
        (pRVar11->super_TextHolder).mText._M_dataplus._M_p =
             (pointer)&(pRVar11->super_TextHolder).mText.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&(pRVar11->super_TextHolder).mText,local_188._0_8_,
                   (byte *)(local_188._0_8_ + local_188._8_8_));
        (pRVar11->super_TextHolder).mCanContainMarkup = false;
        (pRVar11->super_TextHolder).mEncodingFlags = 0xd;
        (pRVar11->super_TextHolder).super_Token._vptr_Token =
             (_func_int **)&PTR__TextHolder_00166388;
        boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::RawText>
                  ((shared_ptr<markdown::Token> *)&local_1e8,pRVar11);
        p_Var17 = (_List_node_base *)operator_new(0x20);
        sVar4 = local_1e8._M_string_length;
        local_1e8._M_string_length = 0;
        p_Var17[1]._M_next = (_List_node_base *)local_1e8._M_dataplus._M_p;
        p_Var17[1]._M_prev = (_List_node_base *)sVar4;
        local_1e8._M_dataplus._M_p = (pointer)0x0;
        std::__detail::_List_node_base::_M_hook(p_Var17);
        local_1a8._16_8_ = local_1a8._16_8_ + 1;
        boost::detail::shared_count::~shared_count((shared_count *)&local_1e8._M_string_length);
        pHVar13 = (HtmlTag *)operator_new(0x30);
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"/a","");
        (pHVar13->super_TextHolder).super_Token._vptr_Token =
             (_func_int **)&PTR__TextHolder_001662d0;
        (pHVar13->super_TextHolder).mText._M_dataplus._M_p =
             (pointer)&(pHVar13->super_TextHolder).mText.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&(pHVar13->super_TextHolder).mText,local_1e8._M_dataplus._M_p,
                   local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
        (pHVar13->super_TextHolder).mCanContainMarkup = false;
        (pHVar13->super_TextHolder).mEncodingFlags = 5;
        (pHVar13->super_TextHolder).super_Token._vptr_Token =
             (_func_int **)&PTR__TextHolder_00166060;
        boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlTag>
                  ((shared_ptr<markdown::Token> *)&local_138,pHVar13);
        p_Var17 = (_List_node_base *)operator_new(0x20);
        sVar4 = local_138._M_string_length;
        local_138._M_string_length = 0;
        p_Var17[1]._M_next = (_List_node_base *)local_138._M_dataplus._M_p;
        p_Var17[1]._M_prev = (_List_node_base *)sVar4;
        local_138._M_dataplus._M_p = (pointer)0x0;
        std::__detail::_List_node_base::_M_hook(p_Var17);
        local_1a8._16_8_ = local_1a8._16_8_ + 1;
        boost::detail::shared_count::~shared_count((shared_count *)&local_138._M_string_length);
        replacements = (ReplacementTable *)local_f8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        pCVar18 = (Container *)operator_new(0x28);
        (pCVar18->super_Token)._vptr_Token = (_func_int **)&PTR__Container_001665b0;
        std::__cxx11::
        list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
        ::list(&pCVar18->mSubTokens,
               (list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                *)local_1a8);
        pCVar18->mParagraphMode = false;
        boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::Container>
                  ((shared_ptr<markdown::Token> *)&local_1e8,pCVar18);
        std::
        vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
        ::emplace_back<boost::shared_ptr<markdown::Token>>
                  ((vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
                    *)replacements,(shared_ptr<markdown::Token> *)&local_1e8);
        boost::detail::shared_count::~shared_count((shared_count *)&local_1e8._M_string_length);
        psVar26 = (string *)local_1a8;
LAB_0014a0e2:
        std::__cxx11::
        _List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
        ::_M_clear((_List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                    *)psVar26);
      }
      else {
        local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_188._0_8_;
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_188._0_8_ + local_188._8_8_);
        paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._0_8_;
        if (0 < (long)local_188._8_8_ >> 2) {
          local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(local_188._0_8_ + local_188._8_8_);
          paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_188._0_8_ + (local_188._8_8_ & 0xfffffffffffffffc));
          lVar19 = ((long)local_188._8_8_ >> 2) + 1;
          paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_188._0_8_ + 3);
          do {
            bVar29 = *(byte *)((long)paVar21 + -3);
            iVar8 = isalnum((int)(char)bVar29);
            if ((iVar8 == 0) &&
               ((0x3a < bVar29 - 0x25 ||
                ((0x400000000000341U >> ((ulong)(bVar29 - 0x25) & 0x3f) & 1) == 0)))) {
              paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)paVar21 + -3);
              paVar20 = local_f0;
              goto LAB_0014a106;
            }
            bVar29 = *(byte *)((long)paVar21 + -2);
            iVar8 = isalnum((int)(char)bVar29);
            if ((iVar8 == 0) &&
               ((0x3a < bVar29 - 0x25 ||
                ((0x400000000000341U >> ((ulong)(bVar29 - 0x25) & 0x3f) & 1) == 0)))) {
              paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)paVar21 + -2);
              paVar20 = local_f0;
              goto LAB_0014a106;
            }
            bVar29 = *(byte *)((long)paVar21 + -1);
            iVar8 = isalnum((int)(char)bVar29);
            if ((iVar8 == 0) &&
               ((0x3a < bVar29 - 0x25 ||
                ((0x400000000000341U >> ((ulong)(bVar29 - 0x25) & 0x3f) & 1) == 0)))) {
              paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)paVar21 + -1);
              paVar20 = local_f0;
              goto LAB_0014a106;
            }
            bVar29 = paVar21->_M_local_buf[0];
            iVar8 = isalnum((int)(char)bVar29);
            paVar20 = local_f0;
            if ((iVar8 == 0) &&
               ((0x3a < bVar29 - 0x25 ||
                ((0x400000000000341U >> ((ulong)(bVar29 - 0x25) & 0x3f) & 1) == 0))))
            goto LAB_0014a106;
            lVar19 = lVar19 + -1;
            paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)paVar21 + 4);
          } while (1 < lVar19);
        }
        paVar21 = paVar28;
        lVar19 = (long)paVar20 - (long)paVar21;
        if (lVar19 == 1) {
LAB_00149e15:
          bVar29 = paVar21->_M_local_buf[0];
          iVar8 = isalnum((int)(char)bVar29);
          if ((iVar8 == 0) &&
             ((0x3a < bVar29 - 0x25 ||
              ((0x400000000000341U >> ((ulong)(bVar29 - 0x25) & 0x3f) & 1) == 0))))
          goto LAB_0014a106;
        }
        else {
          if (lVar19 == 2) {
LAB_00149ddd:
            bVar29 = paVar21->_M_local_buf[0];
            iVar8 = isalnum((int)(char)bVar29);
            if ((iVar8 != 0) ||
               ((bVar29 - 0x25 < 0x3b &&
                ((0x400000000000341U >> ((ulong)(bVar29 - 0x25) & 0x3f) & 1) != 0)))) {
              paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)paVar21 + 1);
              goto LAB_00149e15;
            }
          }
          else {
            if (lVar19 != 3) goto LAB_0014a150;
            bVar29 = paVar21->_M_local_buf[0];
            iVar8 = isalnum((int)(char)bVar29);
            if ((iVar8 != 0) ||
               ((bVar29 - 0x25 < 0x3b &&
                ((0x400000000000341U >> ((ulong)(bVar29 - 0x25) & 0x3f) & 1) != 0)))) {
              paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)paVar21 + 1);
              goto LAB_00149ddd;
            }
          }
LAB_0014a106:
          if ((paVar21 != paVar20) && (paVar21 != local_b0 && bVar29 == 0x40)) {
            _Var14 = std::
                     __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<bool(*)(char)>>
                               ((byte *)((long)paVar21 + 1),paVar20,
                                anon_unknown_0::notValidSiteCharacter);
            uVar23 = local_188._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var14._M_current ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_188._0_8_ + local_188._8_8_)) {
              _Var16 = _Var14;
              paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_188._0_8_ + local_188._8_8_);
              if (0 < (long)local_188._8_8_ >> 2) {
                local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(local_188._0_8_ + (ulong)((uint)local_188._8_8_ & 3));
                lVar19 = ((long)local_188._8_8_ >> 2) + 1;
                tVar22 = (type)local_188._8_8_;
                do {
                  iVar8 = isalpha((int)(char)*(byte *)(uVar23 + ((long)tVar22 - 1)));
                  if (iVar8 == 0) {
                    paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(uVar23 + (long)tVar22);
                    goto LAB_0014a438;
                  }
                  iVar8 = isalpha((int)(char)*(byte *)(uVar23 + ((long)tVar22 - 2)));
                  if (iVar8 == 0) {
                    paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(uVar23 + ((long)tVar22 - 1));
                    goto LAB_0014a438;
                  }
                  iVar8 = isalpha((int)(char)*(byte *)(uVar23 + ((long)tVar22 - 3)));
                  if (iVar8 == 0) {
                    paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(uVar23 + ((long)tVar22 - 2));
                    goto LAB_0014a438;
                  }
                  iVar8 = isalpha((int)(char)*(byte *)(uVar23 + ((long)tVar22 - 4)));
                  if (iVar8 == 0) {
                    paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(uVar23 + ((long)tVar22 - 3));
                    goto LAB_0014a438;
                  }
                  tVar22 = (type)((long)tVar22 - 4);
                  lVar19 = lVar19 + -1;
                  _Var16._M_current = (char *)local_f0;
                  paVar20 = local_f0;
                } while (1 < lVar19);
              }
              lVar19 = (long)_Var16._M_current - uVar23;
              if (lVar19 == 1) {
LAB_0014a420:
                iVar8 = isalpha((int)(char)*(byte *)((long)_Var16._M_current + -1));
                paVar28 = paVar20;
                if (iVar8 != 0) {
                  paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)uVar23;
                }
              }
              else if (lVar19 == 2) {
LAB_0014a408:
                iVar8 = isalpha((int)(char)*(byte *)((long)_Var16._M_current + -1));
                paVar28 = paVar20;
                if (iVar8 != 0) {
                  _Var16._M_current = (char *)((long)paVar20 + -1);
                  paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)_Var16._M_current;
                  goto LAB_0014a420;
                }
              }
              else {
                paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)uVar23;
                if ((lVar19 == 3) &&
                   (iVar8 = isalpha((int)(char)*(byte *)((long)_Var16._M_current + -1)),
                   paVar28 = paVar20, iVar8 != 0)) {
                  _Var16._M_current = (char *)((long)paVar20 + -1);
                  paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)_Var16._M_current;
                  goto LAB_0014a408;
                }
              }
LAB_0014a438:
              if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)uVar23 != paVar28) && (*(byte *)((long)paVar28 + -1) == 0x2e)) &&
                 (_Var14._M_current + (-2 - (long)paVar28) < (char *)0x3)) {
                local_1c8._M_dataplus._M_p = (pointer)&local_1c8;
                local_1c8.field_2._M_allocated_capacity = 0;
                local_1c8._M_string_length = (size_type)local_1c8._M_dataplus._M_p;
                pHVar12 = (HtmlAnchorTag *)operator_new(0x30);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1a8,"mailto:",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_188);
                anon_unknown_0::emailEncode
                          (&local_1e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a8);
                local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                local_138._M_string_length = 0;
                local_138.field_2._M_local_buf[0] = '\0';
                paVar20 = &local_1e8.field_2;
                HtmlAnchorTag::HtmlAnchorTag(pHVar12,&local_1e8,&local_138);
                boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlAnchorTag>
                          (&local_118,pHVar12);
                p_Var17 = (_List_node_base *)operator_new(0x20);
                sVar5.pi_ = local_118.pn.pi_;
                local_118.pn.pi_ = (sp_counted_base *)0x0;
                p_Var17[1]._M_next = (_List_node_base *)local_118.px;
                p_Var17[1]._M_prev = (_List_node_base *)sVar5.pi_;
                local_118.px = (element_type *)0x0;
                std::__detail::_List_node_base::_M_hook(p_Var17);
                local_1c8.field_2._M_allocated_capacity =
                     local_1c8.field_2._M_allocated_capacity + 1;
                boost::detail::shared_count::~shared_count(&local_118.pn);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p != &local_138.field_2) {
                  operator_delete(local_138._M_dataplus._M_p,
                                  CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                           local_138.field_2._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._M_dataplus._M_p != paVar20) {
                  operator_delete(local_1e8._M_dataplus._M_p,
                                  local_1e8.field_2._M_allocated_capacity + 1);
                }
                if ((string *)local_1a8._0_8_ != (string *)&((string *)local_1a8)->field_2) {
                  operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
                }
                pRVar11 = (RawText *)operator_new(0x30);
                anon_unknown_0::emailEncode(&local_1e8,(string *)local_188);
                (pRVar11->super_TextHolder).super_Token._vptr_Token =
                     (_func_int **)&PTR__TextHolder_001662d0;
                (pRVar11->super_TextHolder).mText._M_dataplus._M_p =
                     (pointer)&(pRVar11->super_TextHolder).mText.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&(pRVar11->super_TextHolder).mText,local_1e8._M_dataplus._M_p,
                           local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
                (pRVar11->super_TextHolder).mCanContainMarkup = false;
                (pRVar11->super_TextHolder).mEncodingFlags = 0xd;
                (pRVar11->super_TextHolder).super_Token._vptr_Token =
                     (_func_int **)&PTR__TextHolder_00166388;
                boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::RawText>
                          ((shared_ptr<markdown::Token> *)local_1a8,pRVar11);
                p_Var17 = (_List_node_base *)operator_new(0x20);
                uVar23 = local_1a8._8_8_;
                local_1a8._8_8_ = (_List_node_base *)0x0;
                p_Var17[1]._M_next = (_List_node_base *)local_1a8._0_8_;
                p_Var17[1]._M_prev = (_List_node_base *)uVar23;
                local_1a8._0_8_ = (_List_node_base *)0x0;
                std::__detail::_List_node_base::_M_hook(p_Var17);
                local_1c8.field_2._M_allocated_capacity =
                     local_1c8.field_2._M_allocated_capacity + 1;
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&((string *)local_1a8)->_M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._M_dataplus._M_p != paVar20) {
                  operator_delete(local_1e8._M_dataplus._M_p,
                                  local_1e8.field_2._M_allocated_capacity + 1);
                }
                pHVar13 = (HtmlTag *)operator_new(0x30);
                local_1e8._M_dataplus._M_p = (pointer)paVar20;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"/a","");
                (pHVar13->super_TextHolder).super_Token._vptr_Token =
                     (_func_int **)&PTR__TextHolder_001662d0;
                (pHVar13->super_TextHolder).mText._M_dataplus._M_p =
                     (pointer)&(pHVar13->super_TextHolder).mText.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&(pHVar13->super_TextHolder).mText,local_1e8._M_dataplus._M_p,
                           local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
                (pHVar13->super_TextHolder).mCanContainMarkup = false;
                (pHVar13->super_TextHolder).mEncodingFlags = 5;
                (pHVar13->super_TextHolder).super_Token._vptr_Token =
                     (_func_int **)&PTR__TextHolder_00166060;
                boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlTag>
                          ((shared_ptr<markdown::Token> *)local_1a8,pHVar13);
                p_Var17 = (_List_node_base *)operator_new(0x20);
                uVar23 = local_1a8._8_8_;
                local_1a8._8_8_ = (string *)0x0;
                p_Var17[1]._M_next = (_List_node_base *)local_1a8._0_8_;
                p_Var17[1]._M_prev = (_List_node_base *)uVar23;
                local_1a8._0_8_ = (string *)0x0;
                std::__detail::_List_node_base::_M_hook(p_Var17);
                local_1c8.field_2._M_allocated_capacity =
                     local_1c8.field_2._M_allocated_capacity + 1;
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&((string *)local_1a8)->_M_string_length);
                replacements = (ReplacementTable *)local_f8;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._M_dataplus._M_p != paVar20) {
                  operator_delete(local_1e8._M_dataplus._M_p,
                                  local_1e8.field_2._M_allocated_capacity + 1);
                }
                pCVar18 = (Container *)operator_new(0x28);
                (pCVar18->super_Token)._vptr_Token = (_func_int **)&PTR__Container_001665b0;
                std::__cxx11::
                list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                ::list(&pCVar18->mSubTokens,
                       (list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                        *)&local_1c8);
                pCVar18->mParagraphMode = false;
                boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::Container>
                          ((shared_ptr<markdown::Token> *)&local_1e8,pCVar18);
                std::
                vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
                ::emplace_back<boost::shared_ptr<markdown::Token>>
                          ((vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
                            *)replacements,(shared_ptr<markdown::Token> *)&local_1e8);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&local_1e8._M_string_length);
                psVar26 = &local_1c8;
                goto LAB_0014a0e2;
              }
            }
          }
        }
LAB_0014a150:
        pvVar9 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&local_88,8);
        replacements_00 = local_f8;
        paVar20 = &local_1e8.field_2;
        local_1e8._M_dataplus._M_p = (pointer)paVar20;
        if (pvVar9->matched == true) {
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_1e8,
                     (pvVar9->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (pvVar9->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          local_1e8._M_string_length = 0;
          local_1e8.field_2._M_allocated_capacity =
               local_1e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        }
        sVar15 = isValidTag(&local_1e8,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != paVar20) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if (sVar15 == 0) {
          pRVar11 = (RawText *)operator_new(0x30);
          pvVar9 = boost::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](&local_88,0);
          if (pvVar9->matched == true) {
            local_1e8._M_dataplus._M_p = (pointer)paVar20;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_1e8,
                       (pvVar9->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).first._M_current,
                       (pvVar9->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).second._M_current);
          }
          else {
            local_1e8._M_string_length = 0;
            local_1e8.field_2._M_allocated_capacity =
                 local_1e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_1e8._M_dataplus._M_p = (pointer)paVar20;
          }
          (pRVar11->super_TextHolder).super_Token._vptr_Token =
               (_func_int **)&PTR__TextHolder_001662d0;
          (pRVar11->super_TextHolder).mText._M_dataplus._M_p =
               (pointer)&(pRVar11->super_TextHolder).mText.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&(pRVar11->super_TextHolder).mText,local_1e8._M_dataplus._M_p,
                     local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
          (pRVar11->super_TextHolder).mCanContainMarkup = true;
          (pRVar11->super_TextHolder).mEncodingFlags = 0xd;
          (pRVar11->super_TextHolder).super_Token._vptr_Token =
               (_func_int **)&PTR__TextHolder_00166388;
          boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::RawText>
                    ((shared_ptr<markdown::Token> *)local_1a8,pRVar11);
          replacements = (ReplacementTable *)local_f8;
          std::
          vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
          ::emplace_back<boost::shared_ptr<markdown::Token>>
                    (local_f8,(shared_ptr<markdown::Token> *)local_1a8);
        }
        else {
          pHVar13 = (HtmlTag *)operator_new(0x30);
          _restoreProcessedItems(&local_1e8,(string *)local_188,(ReplacementTable *)replacements_00)
          ;
          (pHVar13->super_TextHolder).super_Token._vptr_Token =
               (_func_int **)&PTR__TextHolder_001662d0;
          (pHVar13->super_TextHolder).mText._M_dataplus._M_p =
               (pointer)&(pHVar13->super_TextHolder).mText.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&(pHVar13->super_TextHolder).mText,local_1e8._M_dataplus._M_p,
                     local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
          (pHVar13->super_TextHolder).mCanContainMarkup = false;
          (pHVar13->super_TextHolder).mEncodingFlags = 5;
          (pHVar13->super_TextHolder).super_Token._vptr_Token =
               (_func_int **)&PTR__TextHolder_00166060;
          boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlTag>
                    ((shared_ptr<markdown::Token> *)local_1a8,pHVar13);
          replacements = (ReplacementTable *)local_f8;
          std::
          vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
          ::emplace_back<boost::shared_ptr<markdown::Token>>
                    (local_f8,(shared_ptr<markdown::Token> *)local_1a8);
        }
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&((string *)local_1a8)->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != paVar20) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
      }
      uVar23 = local_178._M_allocated_capacity;
      _Var25._M_p = (pointer)local_188._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._0_8_ != &local_178) goto LAB_00149be3;
    }
    boost::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results(&local_88);
  } while( true );
}

Assistant:

std::string RawText::_processLinksImagesAndTags(const std::string &src,
	ReplacementTable& replacements, const LinkIds& idTable)
{
	// NOTE: Kludge alert! The "inline link or image" regex should be...
	//
	//   "(?:(!?)\\[(.+?)\\] *\\((.*?)\\))"
	//
	// ...but that fails on the 'Images' test because it includes a "stupid URL"
	// that has parentheses within it. The proper way to deal with this would be
	// to match any nested parentheses, but regular expressions can't handle an
	// unknown number of nested items, so I'm cheating -- the regex for it
	// allows for one (and *only* one) pair of matched parentheses within the
	// URL. It makes the regex hard to follow (it was even harder to get right),
	// but it allows it to pass the test.
	//
	// The "reference link or image" one has a similar problem; it should be...
	//
	//   "|(?:(!?)\\[(.+?)\\](?: *\\[(.*?)\\])?)"
	//
	static const boost::regex cExpression(
		"(?:(!?)\\[([^\\]]+?)\\] *\\(([^\\(]*(?:\\(.*?\\).*?)*?)\\))" // Inline link or image
		"|(?:(!?)\\[((?:[^]]*?\\[.*?\\].*?)|(?:.+?))\\](?: *\\[(.*?)\\])?)" // Reference link or image
		"|(?:<(/?([a-zA-Z0-9]+).*?)>)" // potential HTML tag or auto-link
	);
	// Important captures: 1/4=image indicator, 2/5=contents/alttext,
	// 3=URL/title, 6=optional link ID, 7=potential HTML tag or auto-link
	// contents, 8=actual tag from 7.

	std::string tgt;
	std::string::const_iterator prev=src.begin(), end=src.end();
	while (1) {
		boost::smatch m;
		if (boost::regex_search(prev, end, m, cExpression)) {
			assert(m[0].matched);
			assert(m[0].length()!=0);

			tgt+=std::string(prev, m[0].first);
			tgt+="\x01@"+boost::lexical_cast<std::string>(replacements.size())+"@links&Images1\x01";
			prev=m[0].second;

			bool isImage=false, isLink=false, isReference=false;
			if (m[4].matched && m[4].length()) isImage=isReference=true;
			else if (m[1].matched && m[1].length()) isImage=true;
			else if (m[5].matched) isLink=isReference=true;
			else if (m[2].matched) isLink=true;

			if (isImage || isLink) {
				std::string contentsOrAlttext, url, title;
				bool resolved=false;
				if (isReference) {
					contentsOrAlttext=m[5];
					std::string linkId=(m[6].matched ? std::string(m[6]) : std::string());
					if (linkId.empty()) linkId=cleanTextLinkRef(contentsOrAlttext);

					optional<markdown::LinkIds::Target> target=idTable.find(linkId);
					if (target) { url=target->url; title=target->title; resolved=true; };
				} else {
					static const boost::regex cReference("^<?([^ >]*)>?(?: *(?:('|\")(.*)\\2)|(?:\\((.*)\\)))? *$");
					// Useful captures: 1=url, 3/4=title
					contentsOrAlttext=m[2];
					std::string urlAndTitle=m[3];
					boost::smatch mm;
					if (boost::regex_match(urlAndTitle, mm, cReference)) {
						url=mm[1];
						if (mm[3].matched) title=mm[3];
						else if (mm[4].matched) title=mm[4];
						resolved=true;
					}
				}

				if (!resolved) {
					// Just encode the first character as-is, and continue
					// searching after it.
					prev=m[0].first+1;
					replacements.push_back(TokenPtr(new RawText(std::string(m[0].first, prev))));
				} else if (isImage) {
					replacements.push_back(TokenPtr(new Image(contentsOrAlttext,
						url, title)));
				} else {
					replacements.push_back(TokenPtr(new HtmlAnchorTag(url, title)));
					tgt+=contentsOrAlttext;
					tgt+="\x01@"+boost::lexical_cast<std::string>(replacements.size())+"@links&Images2\x01";
					replacements.push_back(TokenPtr(new HtmlTag("/a")));
				}
			} else {
				// Otherwise it's an HTML tag or auto-link.
				std::string contents=m[7];

//				cerr << "Evaluating potential HTML or auto-link: " << contents << endl;
//				cerr << "m[8]=" << m[8] << endl;

				if (looksLikeUrl(contents)) {
					TokenGroup subgroup;
					subgroup.push_back(TokenPtr(new HtmlAnchorTag(contents)));
					subgroup.push_back(TokenPtr(new RawText(contents, false)));
					subgroup.push_back(TokenPtr(new HtmlTag("/a")));
					replacements.push_back(TokenPtr(new Container(subgroup)));
				} else if (looksLikeEmailAddress(contents)) {
					TokenGroup subgroup;
					subgroup.push_back(TokenPtr(new HtmlAnchorTag(emailEncode("mailto:"+contents))));
					subgroup.push_back(TokenPtr(new RawText(emailEncode(contents), false)));
					subgroup.push_back(TokenPtr(new HtmlTag("/a")));
					replacements.push_back(TokenPtr(new Container(subgroup)));
				} else if (isValidTag(m[8])) {
					replacements.push_back(TokenPtr(new HtmlTag(_restoreProcessedItems(contents, replacements))));
				} else {
					// Just encode it as-is
					replacements.push_back(TokenPtr(new RawText(m[0])));
				}
			}
		} else {
			tgt+=std::string(prev, end);
			break;
		}
	}
	return tgt;
}